

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall cmCacheManager::CacheEntry::GetPropertyAsBool(CacheEntry *this,string *prop)

{
  bool bVar1;
  cmValue val;
  string *prop_local;
  CacheEntry *this_local;
  
  val = GetProperty(this,prop);
  bVar1 = cmIsOn(val);
  return bVar1;
}

Assistant:

bool cmCacheManager::CacheEntry::GetPropertyAsBool(
  const std::string& prop) const
{
  return cmIsOn(this->GetProperty(prop));
}